

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifestuff.cpp
# Opt level: O3

int AF_A_GetHurt(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  byte *pbVar1;
  VM_UBYTE VVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  PClass *pPVar7;
  AActor *pAVar8;
  AActor *ent;
  VMValue *pVVar9;
  char *__assertion;
  bool bVar10;
  bool bVar11;
  FSoundID local_2c;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005fd8bc;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005fd8ac;
  ent = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (ent == (AActor *)0x0) goto LAB_005fd757;
    pPVar7 = (ent->super_DThinker).super_DObject.Class;
    if (pPVar7 == (PClass *)0x0) {
      iVar5 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
      pPVar7 = (PClass *)CONCAT44(extraout_var,iVar5);
      (ent->super_DThinker).super_DObject.Class = pPVar7;
    }
    bVar10 = pPVar7 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar10;
    bVar11 = pPVar7 == pPVar4;
    if (!bVar11 && !bVar10) {
      do {
        pPVar7 = pPVar7->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar7 != (PClass *)0x0);
        if (pPVar7 == pPVar4) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    pVVar9 = (VMValue *)(ulong)(bVar11 || bVar10);
    uVar6 = (uint)bVar10;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005fd8bc;
    }
  }
  else {
    if (ent != (AActor *)0x0) goto LAB_005fd8ac;
LAB_005fd757:
    ent = (AActor *)0x0;
    pVVar9 = param;
    uVar6 = numparam;
  }
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar2 = param[1].field_0.field_3.Type;
    if (VVar2 != 0xff) {
      if (VVar2 != '\x03') {
LAB_005fd8ac:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005fd8bc;
      }
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar3 != (undefined8 *)0x0) {
          pPVar7 = (PClass *)puVar3[1];
          if (pPVar7 == (PClass *)0x0) {
            pPVar7 = (PClass *)(**(code **)*puVar3)(puVar3,pVVar9,uVar6,ret);
            puVar3[1] = pPVar7;
          }
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar4 && bVar10) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar10 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar4) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          if (!bVar10) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005fd8bc;
          }
        }
      }
      else if (puVar3 != (undefined8 *)0x0) goto LAB_005fd8ac;
    }
    if (((2 < numparam) && (VVar2 = param[2].field_0.field_3.Type, VVar2 != 0xff)) &&
       ((VVar2 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005fd8bc:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                    ,0x6f,"int AF_A_GetHurt(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  pbVar1 = (byte *)((long)&(ent->flags4).Value + 1);
  *pbVar1 = *pbVar1 | 0x80;
  uVar6 = FRandom::GenRand32(&pr_gethurt);
  if ((byte)((char)uVar6 * -0x33) < 0x34) {
    local_2c.ID = (ent->PainSound).super_FSoundID.ID;
    S_Sound(ent,2,&local_2c,1.0,1.0);
    iVar5 = ent->health + -1;
    ent->health = iVar5;
  }
  else {
    iVar5 = ent->health;
  }
  if (0 < iVar5) {
    return 0;
  }
  pAVar8 = (ent->target).field_0.p;
  if (pAVar8 != (AActor *)0x0) {
    if (((pAVar8->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_005fd88f;
    (ent->target).field_0.p = (AActor *)0x0;
  }
  pAVar8 = (AActor *)0x0;
LAB_005fd88f:
  (*(ent->super_DThinker).super_DObject._vptr_DObject[0xf])(ent,pAVar8,pAVar8,0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_GetHurt)
{
	PARAM_ACTION_PROLOGUE;

	self->flags4 |= MF4_INCOMBAT;
	if ((pr_gethurt() % 5) == 0)
	{
		S_Sound (self, CHAN_VOICE, self->PainSound, 1, ATTN_NORM);
		self->health--;
	}
	if (self->health <= 0)
	{
		self->Die (self->target, self->target);
	}
	return 0;
}